

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<asd::Frame<double,_asd::container::vec>_> * __thiscall
pybind11::class_<asd::Frame<double,asd::container::vec>>::
def_readwrite<asd::Frame<double,asd::container::vec>,asd::FrameHeader,char[39]>
          (class_<asd::Frame<double,asd::container::vec>> *this,char *name,
          offset_in_Header<asd::version<0UL>_>_to_int pm,char (*extra) [39])

{
  return_value_policy local_65 [13];
  is_method local_58;
  type local_50;
  cpp_function local_48;
  cpp_function fset;
  type local_38;
  cpp_function local_30;
  cpp_function fget;
  char (*extra_local) [39];
  offset_in_Header<asd::version<0UL>_>_to_int pm_local;
  char *name_local;
  class_<asd::Frame<double,_asd::container::vec>_> *this_local;
  
  local_38.pm = pm;
  fget.super_function.super_object.super_handle.m_ptr = (function)(function)extra;
  is_method::is_method((is_method *)&fset,(handle *)this);
  cpp_function::
  cpp_function<pybind11::class_<asd::Frame<double,asd::container::vec>>::def_readwrite<asd::Frame<double,asd::container::vec>,asd::FrameHeader,char[39]>(char_const*,asd::FrameHeader_asd::Frame<double,asd::container::vec>::*,char_const(&)[39])::_lambda(asd::Frame<double,asd::container::vec>const&)_1_,pybind11::is_method,void>
            (&local_30,&local_38,(is_method *)&fset);
  local_50.pm = pm;
  is_method::is_method(&local_58,(handle *)this);
  cpp_function::
  cpp_function<pybind11::class_<asd::Frame<double,asd::container::vec>>::def_readwrite<asd::Frame<double,asd::container::vec>,asd::FrameHeader,char[39]>(char_const*,asd::FrameHeader_asd::Frame<double,asd::container::vec>::*,char_const(&)[39])::_lambda(asd::Frame<double,asd::container::vec>&,asd::FrameHeader_const&)_1_,pybind11::is_method,void>
            (&local_48,&local_50,&local_58);
  local_65[0] = reference_internal;
  def_property<pybind11::return_value_policy,char[39]>
            (this,name,&local_30,&local_48,local_65,
             (char (*) [39])fget.super_function.super_object.super_handle.m_ptr);
  cpp_function::~cpp_function(&local_48);
  cpp_function::~cpp_function(&local_30);
  return (class_<asd::Frame<double,_asd::container::vec>_> *)this;
}

Assistant:

class_ &def_readwrite(const char *name, D C::*pm, const Extra &...extra) {
        static_assert(std::is_same<C, type>::value || std::is_base_of<C, type>::value,
                      "def_readwrite() requires a class member (or base class member)");
        cpp_function fget([pm](const type &c) -> const D & { return c.*pm; }, is_method(*this)),
            fset([pm](type &c, const D &value) { c.*pm = value; }, is_method(*this));
        def_property(name, fget, fset, return_value_policy::reference_internal, extra...);
        return *this;
    }